

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * valueAsString<bool>(string *__return_storage_ptr__,bool value)

{
  char *__s;
  allocator<char> local_12;
  undefined1 local_11;
  string *psStack_10;
  bool value_local;
  
  __s = "FALSE";
  if (value) {
    __s = "TRUE";
  }
  local_11 = value;
  psStack_10 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_12)
  ;
  std::allocator<char>::~allocator(&local_12);
  return __return_storage_ptr__;
}

Assistant:

std::string valueAsString<bool>(bool value)
{
  return value ? "TRUE" : "FALSE";
}